

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O3

void ComputeGNSSPosition(double Latitude,double Longitude,double Altitude,int GNSSquality,int nbSat,
                        double HDOP)

{
  double dVar1;
  double *pdVar2;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  interval local_70;
  double local_58;
  double local_50;
  double local_48;
  ulong uStack_40;
  double local_30;
  
  local_50 = Latitude - lat_env;
  local_88 = (Longitude - long_env) * 111194.92664455874;
  local_78 = Altitude - alt_env;
  local_48 = angle_env;
  uStack_40 = 0;
  local_58 = HDOP;
  local_30 = cos(Latitude * 0.017453292519943295);
  dVar1 = local_48;
  local_30 = local_30 * local_88;
  local_50 = local_50 * 111194.92664455874;
  local_48 = -local_48;
  uStack_40 = uStack_40 ^ 0x8000000000000000;
  local_80 = cos(-dVar1);
  dVar1 = sin(local_48);
  local_80 = local_80 * local_30 - dVar1 * local_50;
  local_88 = sin(local_48);
  dVar1 = cos(local_48);
  local_88 = local_88 * local_30 + dVar1 * local_50;
  if (GNSSquality - 1U < 2) {
    if ((nbSat < GPS_high_acc_nbsat) || (GPS_high_acc_HDOP < local_58)) {
      if (nbSat < GPS_med_acc_nbsat) {
        if (0 < nbSat) {
LAB_00152d12:
          if ((nbSat < GPS_low_acc_nbsat) || (GPS_low_acc_HDOP < local_58)) {
            local_90 = local_80 + -10000.0;
            local_98 = local_80 + 10000.0;
            interval::interval(&local_70,&local_90,&local_98);
            interval::operator=((interval *)&x_gps,&local_70);
            local_90 = local_88 + -10000.0;
            local_98 = local_88 + 10000.0;
            interval::interval(&local_70,&local_90,&local_98);
            interval::operator=((interval *)&y_gps,&local_70);
            local_90 = local_78 + -50000.0;
            local_98 = local_78 + 50000.0;
            goto LAB_00152e10;
          }
          goto LAB_00152d38;
        }
      }
      else if ((0 < nbSat) && (GPS_med_acc_HDOP < local_58)) goto LAB_00152d12;
      pdVar2 = &GPS_med_acc;
    }
    else {
      pdVar2 = &GPS_high_acc;
    }
  }
  else if (GNSSquality == 4) {
    if ((0 < nbSat && nbSat < GPS_med_acc_nbsat) || (GPS_med_acc_HDOP < local_58)) {
LAB_00152d38:
      pdVar2 = &GPS_low_acc;
    }
    else {
      pdVar2 = &RTK_fixed_acc;
    }
  }
  else {
    if (GNSSquality != 5) {
      local_90 = -10000.0;
      local_98 = 10000.0;
      interval::interval(&local_70,&local_90,&local_98);
      interval::operator=((interval *)&x_gps,&local_70);
      local_90 = -10000.0;
      local_98 = 10000.0;
      interval::interval(&local_70,&local_90,&local_98);
      interval::operator=((interval *)&y_gps,&local_70);
      local_90 = -10000.0;
      local_98 = 10000.0;
      goto LAB_00152e10;
    }
    if ((0 < nbSat && nbSat < GPS_med_acc_nbsat) || (GPS_med_acc_HDOP < local_58))
    goto LAB_00152d38;
    pdVar2 = &RTK_float_acc;
  }
  local_90 = local_80 - *pdVar2;
  local_98 = local_80 + *pdVar2;
  interval::interval(&local_70,&local_90,&local_98);
  interval::operator=((interval *)&x_gps,&local_70);
  local_90 = local_88 - *pdVar2;
  local_98 = local_88 + *pdVar2;
  interval::interval(&local_70,&local_90,&local_98);
  interval::operator=((interval *)&y_gps,&local_70);
  local_90 = *pdVar2 * -5.0 + local_78;
  local_98 = *pdVar2 * 5.0 + local_78;
LAB_00152e10:
  interval::interval(&local_70,&local_90,&local_98);
  interval::operator=((interval *)&z_gps,&local_70);
  return;
}

Assistant:

inline void ComputeGNSSPosition(double Latitude, double Longitude, double Altitude, int GNSSquality, int nbSat, double HDOP)
{
	double x = 0, y = 0, z = 0;

	GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, Latitude, Longitude, Altitude, &x, &y, &z);
	switch (GNSSquality)
	{
	case AUTONOMOUS_GNSS_FIX:
	case DIFFERENTIAL_GNSS_FIX:
		if ((nbSat >= GPS_high_acc_nbsat)&&(HDOP <= GPS_high_acc_HDOP))
		{
			x_gps = interval(x-GPS_high_acc, x+GPS_high_acc);
			y_gps = interval(y-GPS_high_acc, y+GPS_high_acc);
			z_gps = interval(z-5.0*GPS_high_acc, z+5.0*GPS_high_acc);
		}
		else if (((nbSat >= GPS_med_acc_nbsat)&&(HDOP <= GPS_med_acc_HDOP))||(nbSat <= 0))
		{
			// Default accuracy...
			x_gps = interval(x-GPS_med_acc, x+GPS_med_acc);
			y_gps = interval(y-GPS_med_acc, y+GPS_med_acc);
			z_gps = interval(z-5.0*GPS_med_acc, z+5.0*GPS_med_acc);
		}
		else if ((nbSat >= GPS_low_acc_nbsat)&&(HDOP <= GPS_low_acc_HDOP))
		{
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-MAX_UNCERTAINTY, x+MAX_UNCERTAINTY);
			y_gps = interval(y-MAX_UNCERTAINTY, y+MAX_UNCERTAINTY);
			z_gps = interval(z-5.0*MAX_UNCERTAINTY, z+5.0*MAX_UNCERTAINTY);
		}
		break;
	case RTK_FLOAT:
		if (((nbSat < GPS_med_acc_nbsat)&&(nbSat > 0))||(HDOP > GPS_med_acc_HDOP))
		{
			// Probably about to lose GPS soon...
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-RTK_float_acc, x+RTK_float_acc);
			y_gps = interval(y-RTK_float_acc, y+RTK_float_acc);
			z_gps = interval(z-5.0*RTK_float_acc, z+5.0*RTK_float_acc);
		}
		break;
	case RTK_FIXED:
		if (((nbSat < GPS_med_acc_nbsat)&&(nbSat > 0))||(HDOP > GPS_med_acc_HDOP))
		{
			// Probably about to lose GPS soon...
			x_gps = interval(x-GPS_low_acc, x+GPS_low_acc);
			y_gps = interval(y-GPS_low_acc, y+GPS_low_acc);
			z_gps = interval(z-5.0*GPS_low_acc, z+5.0*GPS_low_acc);
		}
		else
		{
			x_gps = interval(x-RTK_fixed_acc, x+RTK_fixed_acc);
			y_gps = interval(y-RTK_fixed_acc, y+RTK_fixed_acc);
			z_gps = interval(z-5.0*RTK_fixed_acc, z+5.0*RTK_fixed_acc);
		}
		break;
	case GNSS_NO_FIX:
	case GNSS_ESTIMATED_FIX:
	default:
		x_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		y_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		z_gps = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
		break;
	}
}